

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthRobots.cpp
# Opt level: O0

int ForthToInt(Forth *forth)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_20;
  _Self local_18;
  iterator it;
  Forth *forth_local;
  
  it._M_node = (_Base_ptr)forth;
  local_18._M_node =
       (_Base_ptr)
       std::
       map<const_cppforth::Forth_*,_int,_std::less<const_cppforth::Forth_*>,_std::allocator<std::pair<const_cppforth::Forth_*const,_int>_>_>
       ::find(&Forth2Int,(key_type *)&it);
  local_20._M_node =
       (_Base_ptr)
       std::
       map<const_cppforth::Forth_*,_int,_std::less<const_cppforth::Forth_*>,_std::allocator<std::pair<const_cppforth::Forth_*const,_int>_>_>
       ::end(&Forth2Int);
  bVar1 = std::operator==(&local_18,&local_20);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!\"wrong forth class instance is used\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/VladlenPopolitov[P]ForthScriptCpp/examples/ForthRobots/ForthRobots.cpp"
                  ,0x69,"int ForthToInt(const cppforth::Forth *)");
  }
  ppVar2 = std::_Rb_tree_iterator<std::pair<const_cppforth::Forth_*const,_int>_>::operator->
                     (&local_18);
  return ppVar2->second;
}

Assistant:

int ForthToInt(const cppforth::Forth* forth){
	auto it=Forth2Int.find(forth);
	if (it != Forth2Int.end()){
		return it->second;
	}
	else {
		assert(!"wrong forth class instance is used");
		return 2;
	}
}